

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_elements_transaction.cpp
# Opt level: O3

int CfdGetTxInIssuanceInfoByHandle
              (void *handle,void *tx_data_handle,uint32_t index,char **entropy,char **nonce,
              int64_t *asset_amount,char **asset_value,int64_t *token_amount,char **token_value,
              char **asset_rangeproof,char **token_rangeproof)

{
  ByteData *pBVar1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  char *pcVar4;
  int64_t iVar5;
  char *pcVar6;
  pointer puVar7;
  char *pcVar8;
  char *pcVar9;
  CfdException *pCVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  size_t sVar14;
  Amount AVar15;
  char *work_asset_rangeproof;
  char *work_token_value;
  char *work_asset_value;
  char *work_nonce;
  char *work_entropy;
  ConfidentialTxInReference ref;
  bool local_279;
  undefined1 local_278 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268;
  ByteData local_258;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  ConfidentialValue local_210;
  char *local_1e8;
  char *local_1e0;
  undefined8 local_1d8;
  ConfidentialValue local_1d0;
  void *local_1a8;
  char **local_1a0;
  char **local_198;
  ConfidentialTxInReference local_190;
  
  local_218 = (char *)0x0;
  local_220 = (char *)0x0;
  local_228 = (char *)0x0;
  local_230 = (char *)0x0;
  local_238 = (char *)0x0;
  local_1d8 = 0;
  local_1a0 = nonce;
  local_198 = entropy;
  cfd::Initialize();
  pBVar1 = &local_190.super_AbstractTxInReference.txid_.data_;
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"TransactionData","");
  cfd::capi::CheckBuffer(tx_data_handle,(string *)&local_190);
  if ((ByteData *)local_190.super_AbstractTxInReference._vptr_AbstractTxInReference != pBVar1) {
    operator_delete(local_190.super_AbstractTxInReference._vptr_AbstractTxInReference);
  }
  local_279 = false;
  cfd::capi::ConvertNetType(*(int *)((long)tx_data_handle + 0x10),&local_279);
  if (*(ConfidentialTransaction **)((long)tx_data_handle + 0x18) != (ConfidentialTransaction *)0x0)
  {
    if (local_279 == true) {
      pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
      local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_190,"Invalid handle state. tx is bitcoin.","");
      cfd::core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)&local_190);
      __cxa_throw(pCVar10,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException)
      ;
    }
    cfd::core::ConfidentialTransaction::GetTxIn
              (&local_190,*(ConfidentialTransaction **)((long)tx_data_handle + 0x18),index);
    if (local_198 == (char **)0x0) {
      local_1e0 = (char *)0x0;
    }
    else {
      local_278 = (undefined1  [8])0x0;
      paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_268._M_allocated_capacity = 0;
      uVar11 = (long)local_190.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_190.asset_entropy_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar11 == 0) {
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
        sVar14 = 0;
      }
      else {
        if ((long)uVar11 < 0) {
          std::__throw_bad_alloc();
        }
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)operator_new(uVar11);
        sVar14 = (long)local_190.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_190.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      local_268._M_allocated_capacity = (size_type)(paVar3->_M_local_buf + uVar11);
      local_278 = (undefined1  [8])paVar3;
      if (local_190.asset_entropy_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_190.asset_entropy_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        paStack_270 = paVar3;
        memmove(paVar3,local_190.asset_entropy_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar14);
      }
      paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar3->_M_local_buf + sVar14);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_210,(ByteData256 *)local_278);
      cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_1d0,(BlindFactor *)&local_210);
      local_218 = cfd::capi::CreateString((string *)&local_1d0);
      local_1e0 = local_218;
      if (local_1d0._vptr_ConfidentialValue !=
          (_func_int **)
          ((long)&local_1d0.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_1d0._vptr_ConfidentialValue);
      }
      local_210._vptr_ConfidentialValue = (_func_int **)&PTR__BlindFactor_00723500;
      if (local_210.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_278 != (undefined1  [8])0x0) {
        operator_delete((void *)local_278);
      }
    }
    if (local_1a0 == (char **)0x0) {
      local_1e8 = (char *)0x0;
    }
    else {
      local_278 = (undefined1  [8])0x0;
      paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x0;
      local_268._M_allocated_capacity = 0;
      uVar11 = (long)local_190.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_190.blinding_nonce_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar11 == 0) {
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
        sVar14 = 0;
      }
      else {
        if ((long)uVar11 < 0) {
          std::__throw_bad_alloc();
        }
        paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)operator_new(uVar11);
        sVar14 = (long)local_190.blinding_nonce_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_190.blinding_nonce_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      local_268._M_allocated_capacity = (size_type)(paVar3->_M_local_buf + uVar11);
      local_278 = (undefined1  [8])paVar3;
      if (local_190.blinding_nonce_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_190.blinding_nonce_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        paStack_270 = paVar3;
        memmove(paVar3,local_190.blinding_nonce_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar14);
      }
      paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(paVar3->_M_local_buf + sVar14);
      cfd::core::BlindFactor::BlindFactor((BlindFactor *)&local_210,(ByteData256 *)local_278);
      cfd::core::BlindFactor::GetHex_abi_cxx11_((string *)&local_1d0,(BlindFactor *)&local_210);
      local_220 = cfd::capi::CreateString((string *)&local_1d0);
      local_1e8 = local_220;
      if (local_1d0._vptr_ConfidentialValue !=
          (_func_int **)
          ((long)&local_1d0.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data + 8U)) {
        operator_delete(local_1d0._vptr_ConfidentialValue);
      }
      local_210._vptr_ConfidentialValue = (_func_int **)&PTR__BlindFactor_00723500;
      if (local_210.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_278 != (undefined1  [8])0x0) {
        operator_delete((void *)local_278);
      }
    }
    cfd::core::ConfidentialValue::ConfidentialValue(&local_1d0,&local_190.issuance_amount_);
    cfd::core::ConfidentialValue::ConfidentialValue(&local_210,&local_190.inflation_keys_);
    if (asset_amount != (int64_t *)0x0) {
      bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_1d0);
      if (!bVar2) {
        bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_1d0);
        if (bVar2) {
          iVar5 = 0;
        }
        else {
          AVar15 = cfd::core::ConfidentialValue::GetAmount(&local_1d0);
          local_278 = (undefined1  [8])AVar15.amount_;
          paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(paStack_270._1_7_,AVar15.ignore_check_);
          iVar5 = cfd::core::Amount::GetSatoshiValue((Amount *)local_278);
        }
        *asset_amount = iVar5;
      }
    }
    if (asset_value == (char **)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_278,&local_1d0);
      pcVar4 = cfd::capi::CreateString((string *)local_278);
      local_228 = pcVar4;
      if (local_278 != (undefined1  [8])&local_268) {
        operator_delete((void *)local_278);
      }
    }
    if (token_amount != (int64_t *)0x0) {
      bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_210);
      if (!bVar2) {
        bVar2 = cfd::core::ConfidentialValue::HasBlinding(&local_210);
        if (bVar2) {
          iVar5 = 0;
        }
        else {
          AVar15 = cfd::core::ConfidentialValue::GetAmount(&local_210);
          local_278 = (undefined1  [8])AVar15.amount_;
          paStack_270 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT71(paStack_270._1_7_,AVar15.ignore_check_);
          iVar5 = cfd::core::Amount::GetSatoshiValue((Amount *)local_278);
        }
        *token_amount = iVar5;
      }
    }
    if (token_value == (char **)0x0) {
      pcVar6 = (char *)0x0;
    }
    else {
      cfd::core::ConfidentialValue::GetHex_abi_cxx11_((string *)local_278,&local_210);
      pcVar6 = cfd::capi::CreateString((string *)local_278);
      local_230 = pcVar6;
      if (local_278 != (undefined1  [8])&local_268) {
        operator_delete((void *)local_278);
      }
    }
    if (asset_rangeproof == (char **)0x0) {
      pcVar8 = (char *)0x0;
    }
    else {
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar11 = (long)local_190.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_190.issuance_amount_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (uVar11 == 0) {
        puVar7 = (pointer)0x0;
        sVar14 = 0;
      }
      else {
        if ((long)uVar11 < 0) {
          std::__throw_bad_alloc();
        }
        puVar7 = (pointer)operator_new(uVar11);
        sVar14 = (long)local_190.issuance_amount_rangeproof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_190.issuance_amount_rangeproof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar7 + uVar11;
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar7;
      if (local_190.issuance_amount_rangeproof_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_190.issuance_amount_rangeproof_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar7;
        memmove(puVar7,local_190.issuance_amount_rangeproof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar14);
      }
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7 + sVar14;
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_278,&local_258);
      pcVar8 = cfd::capi::CreateString((string *)local_278);
      local_238 = pcVar8;
      if (local_278 != (undefined1  [8])&local_268) {
        operator_delete((void *)local_278);
      }
      if (local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (token_rangeproof == (char **)0x0) {
      pcVar9 = (char *)0x0;
      pcVar12 = local_1e0;
      pcVar13 = local_1e8;
    }
    else {
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar11 = (long)local_190.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)local_190.inflation_keys_rangeproof_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      local_1a8 = handle;
      if (uVar11 == 0) {
        puVar7 = (pointer)0x0;
        sVar14 = 0;
      }
      else {
        if ((long)uVar11 < 0) {
          std::__throw_bad_alloc();
        }
        puVar7 = (pointer)operator_new(uVar11);
        sVar14 = (long)local_190.inflation_keys_rangeproof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_190.inflation_keys_rangeproof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
      }
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = puVar7 + uVar11;
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = puVar7;
      if (local_190.inflation_keys_rangeproof_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          local_190.inflation_keys_rangeproof_.data_.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish = puVar7;
        memmove(puVar7,local_190.inflation_keys_rangeproof_.data_.
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start,sVar14);
      }
      local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar7 + sVar14;
      cfd::core::ByteData::GetHex_abi_cxx11_((string *)local_278,&local_258);
      pcVar9 = cfd::capi::CreateString((string *)local_278);
      pcVar12 = local_1e0;
      pcVar13 = local_1e8;
      if (local_278 != (undefined1  [8])&local_268) {
        operator_delete((void *)local_278);
      }
      if (local_258.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_258.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    if (pcVar12 != (char *)0x0) {
      *local_198 = pcVar12;
    }
    if (pcVar13 != (char *)0x0) {
      *local_1a0 = pcVar13;
    }
    if (pcVar4 != (char *)0x0) {
      *asset_value = pcVar4;
    }
    if (pcVar6 != (char *)0x0) {
      *token_value = pcVar6;
    }
    if (pcVar8 != (char *)0x0) {
      *asset_rangeproof = pcVar8;
    }
    if (pcVar9 != (char *)0x0) {
      *token_rangeproof = pcVar9;
    }
    local_210._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
    if (local_210.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_210.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    local_1d0._vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_00723840;
    if (local_1d0.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1d0.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    cfd::core::ConfidentialTxInReference::~ConfidentialTxInReference(&local_190);
    return 0;
  }
  pCVar10 = (CfdException *)__cxa_allocate_exception(0x30);
  local_190.super_AbstractTxInReference._vptr_AbstractTxInReference = (_func_int **)pBVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_190,"Invalid handle state. tx is null","");
  cfd::core::CfdException::CfdException(pCVar10,kCfdIllegalStateError,(string *)&local_190);
  __cxa_throw(pCVar10,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdGetTxInIssuanceInfoByHandle(
    void* handle, void* tx_data_handle, uint32_t index, char** entropy,
    char** nonce, int64_t* asset_amount, char** asset_value,
    int64_t* token_amount, char** token_value, char** asset_rangeproof,
    char** token_rangeproof) {
  char* work_entropy = nullptr;
  char* work_nonce = nullptr;
  char* work_asset_value = nullptr;
  char* work_token_value = nullptr;
  char* work_asset_rangeproof = nullptr;
  char* work_token_rangeproof = nullptr;
  try {
    cfd::Initialize();
    CheckBuffer(tx_data_handle, kPrefixTransactionData);
    CfdCapiTransactionData* tx_data =
        static_cast<CfdCapiTransactionData*>(tx_data_handle);
    bool is_bitcoin = false;
    ConvertNetType(tx_data->net_type, &is_bitcoin);
    if (tx_data->tx_obj == nullptr) {
      throw CfdException(
          CfdError::kCfdIllegalStateError, "Invalid handle state. tx is null");
    } else if (is_bitcoin) {
      throw CfdException(
          CfdError::kCfdIllegalStateError,
          "Invalid handle state. tx is bitcoin.");
    }

    ConfidentialTransactionContext* tx =
        static_cast<ConfidentialTransactionContext*>(tx_data->tx_obj);
    const ConfidentialTxInReference ref = tx->GetTxIn(index);

    if (entropy != nullptr) {
      work_entropy = CreateString(BlindFactor(ref.GetAssetEntropy()).GetHex());
    }
    if (nonce != nullptr) {
      work_nonce = CreateString(BlindFactor(ref.GetBlindingNonce()).GetHex());
    }
    const ConfidentialValue& asset_obj = ref.GetIssuanceAmount();
    const ConfidentialValue& token_obj = ref.GetInflationKeys();
    if ((asset_amount != nullptr) && (!asset_obj.HasBlinding())) {
      *asset_amount = (asset_obj.HasBlinding())
                          ? 0
                          : asset_obj.GetAmount().GetSatoshiValue();
    }
    if (asset_value != nullptr) {
      work_asset_value = CreateString(asset_obj.GetHex());
    }
    if ((token_amount != nullptr) && (!token_obj.HasBlinding())) {
      *token_amount = (token_obj.HasBlinding())
                          ? 0
                          : token_obj.GetAmount().GetSatoshiValue();
    }
    if (token_value != nullptr) {
      work_token_value = CreateString(token_obj.GetHex());
    }
    if (asset_rangeproof != nullptr) {
      work_asset_rangeproof =
          CreateString(ref.GetIssuanceAmountRangeproof().GetHex());
    }
    if (token_rangeproof != nullptr) {
      work_token_rangeproof =
          CreateString(ref.GetInflationKeysRangeproof().GetHex());
    }

    if (work_entropy != nullptr) *entropy = work_entropy;
    if (work_nonce != nullptr) *nonce = work_nonce;
    if (work_asset_value != nullptr) *asset_value = work_asset_value;
    if (work_token_value != nullptr) *token_value = work_token_value;
    if (work_asset_rangeproof != nullptr)
      *asset_rangeproof = work_asset_rangeproof;
    if (work_token_rangeproof != nullptr)
      *token_rangeproof = work_token_rangeproof;
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    return SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, std_except.what());
    return CfdErrorCode::kCfdUnknownError;
  } catch (...) {
    FreeBufferOnError(
        &work_entropy, &work_nonce, &work_asset_value, &work_token_value,
        &work_asset_rangeproof, &work_token_rangeproof);
    SetLastFatalError(handle, "unknown error.");
    return CfdErrorCode::kCfdUnknownError;
  }
}